

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
          (TiledRgbaInputFile *this,char *name,string *layerName,int numThreads)

{
  ContextInitializer *in_RSI;
  undefined8 in_RDI;
  bool onoff;
  undefined1 local_98 [60];
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  ContextInitializer *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  TiledRgbaInputFile *in_stack_ffffffffffffffc0;
  
  memset(local_98,0,0x78);
  ContextInitializer::ContextInitializer((ContextInitializer *)local_98);
  onoff = SUB81((ulong)in_RDI >> 0x38,0);
  ContextInitializer::silentHeaderParse(in_RSI,onoff);
  ContextInitializer::strictHeaderValidation(in_RSI,onoff);
  TiledRgbaInputFile(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (
    const char name[], const string& layerName, int numThreads)
    : TiledRgbaInputFile (
        name,
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false),
        layerName,
        numThreads)
{
}